

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkAttachmentReference * __thiscall
Fossilize::StateRecorder::Impl::copy<VkAttachmentReference>
          (Impl *this,VkAttachmentReference *src,size_t count,ScratchAllocator *alloc)

{
  VkAttachmentReference *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkAttachmentReference>(alloc,count);
    if (pVVar1 != (VkAttachmentReference *)0x0) {
      pVVar1 = (VkAttachmentReference *)memmove(pVVar1,src,count << 3);
      return pVVar1;
    }
  }
  return (VkAttachmentReference *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}